

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O2

void fnt_font_done(FNT_Face face)

{
  FNT_Font P;
  FT_Memory memory;
  
  P = face->font;
  if (P != (FNT_Font)0x0) {
    memory = (face->root).memory;
    if (P->fnt_frame != (FT_Byte *)0x0) {
      FT_Stream_ReleaseFrame((face->root).stream,&P->fnt_frame);
    }
    ft_mem_free(memory,P->family_name);
    P->family_name = (FT_String *)0x0;
    ft_mem_free(memory,P);
    face->font = (FNT_Font)0x0;
  }
  return;
}

Assistant:

static void
  fnt_font_done( FNT_Face face )
  {
    FT_Memory  memory = FT_FACE( face )->memory;
    FT_Stream  stream = FT_FACE( face )->stream;
    FNT_Font   font   = face->font;


    if ( !font )
      return;

    if ( font->fnt_frame )
      FT_FRAME_RELEASE( font->fnt_frame );
    FT_FREE( font->family_name );

    FT_FREE( font );
    face->font = NULL;
  }